

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O2

void __thiscall
diy::
concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::clear(concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        *this)

{
  lock_guard<fast_mutex> l;
  unique_lock<tthread::fast_mutex> local_20;
  
  Catch::clara::std::unique_lock<tthread::fast_mutex>::unique_lock(&local_20,&this->mutex_);
  Catch::clara::std::
  _Rb_tree<int,_std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::_Select1st<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::_Select1st<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>
           *)this);
  Catch::clara::std::unique_lock<tthread::fast_mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void            clear()                 { lock_guard<fast_mutex> l(mutex_); map_.clear(); }